

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::OnReturnCallIndirect
          (SharedValidator *this,Location *loc,Var *sig_var,Var *table_var)

{
  Result RVar1;
  Var local_100;
  Enum local_b4;
  undefined1 local_b0 [8];
  FuncType func_type;
  Var *table_var_local;
  Var *sig_var_local;
  Location *loc_local;
  SharedValidator *this_local;
  Result result;
  
  Result::Result((Result *)((long)&this_local + 4),Ok);
  this->expr_loc_ = loc;
  Var::Var((Var *)&func_type.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage,table_var);
  RVar1 = CheckTableIndex(this,(Var *)&func_type.results.
                                       super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage,
                          (TableType *)0x0);
  Result::operator|=((Result *)((long)&this_local + 4),RVar1);
  Var::~Var((Var *)&func_type.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
  FuncType::FuncType((FuncType *)local_b0);
  Var::Var(&local_100,sig_var);
  local_b4 = (Enum)CheckFuncTypeIndex(this,&local_100,(FuncType *)local_b0);
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_b4);
  Var::~Var(&local_100);
  RVar1 = TypeChecker::OnReturnCallIndirect
                    (&this->typechecker_,(TypeVector *)local_b0,
                     (TypeVector *)
                     &func_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  Result::operator|=((Result *)((long)&this_local + 4),RVar1);
  FuncType::~FuncType((FuncType *)local_b0);
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::OnReturnCallIndirect(const Location& loc,
                                             Var sig_var,
                                             Var table_var) {
  Result result = Result::Ok;
  expr_loc_ = &loc;
  result |= CheckTableIndex(table_var);
  FuncType func_type;
  result |= CheckFuncTypeIndex(sig_var, &func_type);
  result |=
      typechecker_.OnReturnCallIndirect(func_type.params, func_type.results);
  return result;
}